

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O3

void __thiscall cmGeneratorExpressionDAGChecker::Initialize(cmGeneratorExpressionDAGChecker *this)

{
  _Rb_tree_header *p_Var1;
  cmGeneratorTarget *pcVar2;
  cmGeneratorExpressionDAGChecker *pcVar3;
  bool bVar4;
  Result RVar5;
  cmGeneratorExpressionDAGChecker *this_00;
  _Base_ptr p_Var6;
  const_iterator cVar7;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_01;
  _Base_ptr p_Var8;
  
  pcVar3 = this;
  do {
    this_00 = pcVar3;
    pcVar3 = this_00->Parent;
  } while (this_00->Parent != (cmGeneratorExpressionDAGChecker *)0x0);
  RVar5 = CheckGraph(this);
  this->CheckResult = RVar5;
  if (RVar5 != DAG) {
    return;
  }
  bVar4 = EvaluatingIncludeDirectories(this_00);
  if (((((!bVar4) && (bVar4 = EvaluatingSystemIncludeDirectories(this_00), !bVar4)) &&
       (bVar4 = EvaluatingCompileDefinitions(this_00), !bVar4)) &&
      ((((bVar4 = EvaluatingCompileOptions(this_00), !bVar4 &&
         (bVar4 = EvaluatingAutoUicOptions(this_00), !bVar4)) &&
        ((bVar4 = EvaluatingSources(this_00), !bVar4 &&
         ((bVar4 = EvaluatingCompileFeatures(this_00), !bVar4 &&
          (bVar4 = EvaluatingLinkOptions(this_00), !bVar4)))))) &&
       (bVar4 = EvaluatingLinkDirectories(this_00), !bVar4)))) &&
     (bVar4 = EvaluatingLinkDepends(this_00), !bVar4)) {
    return;
  }
  p_Var6 = (this_00->Seen)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var6 != (_Base_ptr)0x0) {
    p_Var1 = &(this_00->Seen)._M_t._M_impl.super__Rb_tree_header;
    pcVar2 = this->Target;
    p_Var8 = &p_Var1->_M_header;
    do {
      if (*(cmGeneratorTarget **)(p_Var6 + 1) >= pcVar2) {
        p_Var8 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[*(cmGeneratorTarget **)(p_Var6 + 1) < pcVar2];
    } while (p_Var6 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var8 != p_Var1) && (*(cmGeneratorTarget **)(p_Var8 + 1) <= pcVar2))
       && (cVar7 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&p_Var8[1]._M_parent,&this->Property),
          cVar7._M_node != (_Base_ptr)&p_Var8[1]._M_left)) {
      this->CheckResult = ALREADY_SEEN;
      return;
    }
  }
  this_01 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
             *)std::
               map<const_cmGeneratorTarget_*,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&this_00->Seen,&this->Target);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>(this_01,&this->Property);
  return;
}

Assistant:

void cmGeneratorExpressionDAGChecker::Initialize()
{
  const cmGeneratorExpressionDAGChecker* top = this;
  const cmGeneratorExpressionDAGChecker* p = this->Parent;
  while (p) {
    top = p;
    p = p->Parent;
  }
  this->CheckResult = this->CheckGraph();

#define TEST_TRANSITIVE_PROPERTY_METHOD(METHOD) top->METHOD() ||

  if (CheckResult == DAG &&
      (CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD(
        TEST_TRANSITIVE_PROPERTY_METHOD) false)) // NOLINT(*)
#undef TEST_TRANSITIVE_PROPERTY_METHOD
  {
    std::map<cmGeneratorTarget const*, std::set<std::string>>::const_iterator
      it = top->Seen.find(this->Target);
    if (it != top->Seen.end()) {
      const std::set<std::string>& propSet = it->second;
      if (propSet.find(this->Property) != propSet.end()) {
        this->CheckResult = ALREADY_SEEN;
        return;
      }
    }
    const_cast<cmGeneratorExpressionDAGChecker*>(top)
      ->Seen[this->Target]
      .insert(this->Property);
  }
}